

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void do_proficiencies(CHAR_DATA *ch,char *argument)

{
  short *psVar1;
  CHAR_DATA *pCVar2;
  bool bVar3;
  CHAR_DATA **ppCVar4;
  int i;
  long lVar5;
  CProficiencies *pCVar6;
  char_data *trainer;
  char_data *pcVar7;
  
  if ((ch->act[0] & 1) == 0) {
    ppCVar4 = &ch->in_room->people;
    bVar3 = false;
    trainer = (char_data *)0x0;
    while ((pCVar2 = *ppCVar4, pCVar2 != (CHAR_DATA *)0x0 && (!bVar3))) {
      if ((pCVar2->act[0] & 1) == 0) {
        bVar3 = false;
        pcVar7 = trainer;
      }
      else {
        lVar5 = 0;
        do {
          bVar3 = lVar5 != 4;
          pcVar7 = trainer;
          if (lVar5 == 4) break;
          psVar1 = pCVar2->pIndexData->profs_taught + lVar5;
          lVar5 = lVar5 + 1;
          pcVar7 = pCVar2;
        } while (*psVar1 < 0);
      }
      ppCVar4 = &pCVar2->next_in_room;
      trainer = pcVar7;
    }
    if ((trainer == (char_data *)0x0) && (bVar3 = str_cmp(argument,"basic"), bVar3)) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar6 = &prof_none;
      }
      else {
        pCVar6 = &ch->pcdata->profs;
      }
      CProficiencies::ListKnownProficiencies(pCVar6,ch);
      return;
    }
    pCVar6 = (CProficiencies *)argument;
    bVar3 = str_cmp(argument,"basic");
    if (!bVar3) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar6 = &prof_none;
      }
      else {
        pCVar6 = &ch->pcdata->profs;
      }
      CProficiencies::ListBasicProficiencies(pCVar6,ch);
      return;
    }
    if (trainer != (char_data *)0x0) {
      if (*argument == '\0') {
        CProficiencies::GetProfsTaughtByTrainer(pCVar6,ch,trainer);
        return;
      }
      CProficiencies::TrainProficiency(pCVar6,ch,trainer,argument);
      return;
    }
  }
  return;
}

Assistant:

void do_proficiencies(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *trainer = nullptr;
	bool bBreak= false;

	if (IS_NPC(ch))
		return;

	for (auto iterator = ch->in_room->people; iterator && !bBreak; iterator = iterator->next_in_room)
	{
		if (!IS_NPC(iterator))
			continue;

		for (int i = 0; i < MAX_PROFS_TAUGHT_BY_MOB && !bBreak; i++)
		{
			if (iterator->pIndexData->profs_taught[i] > -1)
			{
				bBreak = true;
				trainer = iterator;
				break;
			}
		}
	}

	if (!trainer && str_cmp(argument, "basic"))
	{
		ch->Profs()->ListKnownProficiencies(ch);
		return;
	}
	else if (!str_cmp(argument, "basic"))
	{
		ch->Profs()->ListBasicProficiencies(ch);
		return;
	}

	if (!trainer)
		return;

	if (argument[0] != '\0')
	{
		ch->Profs()->TrainProficiency(ch, trainer, argument);
		return;
	}

	ch->Profs()->GetProfsTaughtByTrainer(ch, trainer);
}